

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

TString * luaX_newstring(LexState *ls,char *str,size_t l)

{
  int iVar1;
  StkId pTVar2;
  TString *pTVar3;
  lua_State *L_00;
  TString *in_RDX;
  Table *in_RSI;
  lua_State *in_RDI;
  TValue *i_o;
  TValue *o;
  TString *ts;
  lua_State *L;
  
  pTVar2 = in_RDI->stack_last;
  pTVar3 = luaS_newlstr(in_RDI,(char *)in_RSI,(size_t)in_RDX);
  L_00 = (lua_State *)luaH_setstr(in_RDI,in_RSI,in_RDX);
  iVar1._0_1_ = L_00->tt;
  iVar1._1_1_ = L_00->marked;
  iVar1._2_1_ = L_00->status;
  iVar1._3_1_ = L_00->field_0xb;
  if (iVar1 == 0) {
    *(undefined4 *)&L_00->next = 1;
    L_00->tt = '\x01';
    L_00->marked = '\0';
    L_00->status = '\0';
    L_00->field_0xb = 0;
    if ((GCObject *)((pTVar2[2].value.gc)->th).hook <= ((pTVar2[2].value.gc)->th).l_gt.value.gc) {
      luaC_step(L_00);
    }
  }
  return pTVar3;
}

Assistant:

static TString*luaX_newstring(LexState*ls,const char*str,size_t l){
lua_State*L=ls->L;
TString*ts=luaS_newlstr(L,str,l);
TValue*o=luaH_setstr(L,ls->fs->h,ts);
if(ttisnil(o)){
setbvalue(o,1);
luaC_checkGC(L);
}
return ts;
}